

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O0

void Maj_ManPrintSolution(Maj_Man_t_conflict *p)

{
  int iVar1;
  uint uVar2;
  int local_18;
  int iVar;
  int k;
  int i;
  Maj_Man_t_conflict *p_local;
  
  printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  iVar1 = p->nObjs;
  while (iVar = iVar1 + -1, p->nVars + 2 <= iVar) {
    printf("%02d = MAJ(",(ulong)(iVar1 - 3));
    for (local_18 = 2; -1 < local_18; local_18 = local_18 + -1) {
      uVar2 = Maj_ManFindFanin(p,iVar,local_18);
      if (((int)uVar2 < 2) || (p->nVars + 2 <= (int)uVar2)) {
        if ((int)uVar2 < 2) {
          printf(" %d",(ulong)uVar2);
        }
        else {
          printf(" %02d",(ulong)(uVar2 - 2));
        }
      }
      else {
        printf(" %c",(ulong)(uVar2 + 0x5f));
      }
    }
    printf(" )\n");
    iVar1 = iVar;
  }
  return;
}

Assistant:

static void Maj_ManPrintSolution( Maj_Man_t * p )
{
    int i, k, iVar;
    printf( "Realization of %d-input majority using %d MAJ3 gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars + 2; i-- )
    {
        printf( "%02d = MAJ(", i-2 );
        for ( k = 2; k >= 0; k-- )
        {
            iVar = Maj_ManFindFanin( p, i, k );
            if ( iVar >= 2 && iVar < p->nVars + 2 )
                printf( " %c", 'a'+iVar-2 );
            else if ( iVar < 2 )
                printf( " %d", iVar );
            else
                printf( " %02d", iVar-2 );
        }
        printf( " )\n" );
    }
}